

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceGLImpl.cpp
# Opt level: O3

void __thiscall Diligent::RenderDeviceGLImpl::FlagSupportedTexFormats(RenderDeviceGLImpl *this)

{
  BIND_FLAGS BVar1;
  TEXTURE_FORMAT TexFormat;
  RENDER_DEVICE_TYPE RVar2;
  pointer pvVar3;
  BIND_FLAGS BVar4;
  bool bVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  GLenum GVar9;
  int iVar10;
  TextureFormatAttribs *pTVar11;
  pointer ppcVar12;
  pointer pvVar13;
  BIND_FLAGS BVar14;
  BIND_FLAGS BVar15;
  BIND_FLAGS BVar16;
  BIND_FLAGS BVar17;
  uint uVar18;
  BIND_FLAGS BVar19;
  const_iterator __end2;
  byte bVar20;
  initializer_list<const_char_*> __l;
  initializer_list<const_char_*> __l_00;
  initializer_list<const_char_*> __l_01;
  initializer_list<const_char_*> __l_02;
  initializer_list<const_char_*> __l_03;
  NativePixelAttribs NVar21;
  undefined1 in_stack_ffffffffffffff08;
  undefined1 uVar22;
  undefined1 uVar23;
  undefined1 uVar24;
  string msg;
  BIND_FLAGS local_d0;
  BIND_FLAGS local_cc;
  BIND_FLAGS local_c8;
  GLint params;
  GLTextureCreateReleaseHelper local_c0;
  void *local_b8;
  GLenum err;
  int TestTextureDim;
  vector<const_char_*,_std::allocator<const_char_*>_> local_a8;
  vector<const_char_*,_std::allocator<const_char_*>_> local_90;
  vector<const_char_*,_std::allocator<const_char_*>_> local_78;
  vector<const_char_*,_std::allocator<const_char_*>_> local_60;
  vector<const_char_*,_std::allocator<const_char_*>_> local_48;
  
  RVar2 = (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.Type;
  local_b8 = (void *)CONCAT44(local_b8._4_4_,RVar2);
  uVar18 = (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.APIVersion.
           Major;
  bVar5 = CheckExtension(this,"GL_EXT_texture_compression_rgtc");
  uVar7 = true;
  uVar6 = true;
  if (!bVar5) {
    uVar6 = CheckExtension(this,"GL_ARB_texture_compression_rgtc");
  }
  bVar5 = CheckExtension(this,"GL_EXT_texture_compression_bptc");
  if (!bVar5) {
    uVar7 = CheckExtension(this,"GL_ARB_texture_compression_bptc");
  }
  bVar5 = CheckExtension(this,"GL_EXT_texture_compression_s3tc");
  uVar22 = true;
  uVar8 = true;
  if (!bVar5) {
    uVar8 = CheckExtension(this,"GL_WEBGL_compressed_texture_s3tc");
  }
  uVar24 = 1;
  if ((int)local_b8 == 3) {
LAB_002e36b9:
    uVar23 = CheckExtension(this,"GL_ARB_ES3_compatibility");
  }
  else {
    uVar24 = CheckExtension(this,"GL_EXT_texture_norm16");
    if (RVar2 != RENDER_DEVICE_TYPE_GLES || uVar18 < 3) {
      uVar22 = CheckExtension(this,"GL_ARB_texture_swizzle");
      goto LAB_002e36b9;
    }
    uVar22 = 1;
    uVar23 = true;
  }
  bVar20 = (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.Features.
           PixelUAVWritesAndAtomics != DEVICE_FEATURE_STATE_DISABLED;
  msg._M_dataplus._M_p = "GL_EXT_render_snorm";
  __l._M_len = 1;
  __l._M_array = (iterator)&msg;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&local_48,__l,(allocator_type *)&params);
  RVar2 = (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.Type;
  if (RVar2 == RENDER_DEVICE_TYPE_GLES) {
    if (((this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.APIVersion.Major
         != 0xffffffff) ||
       (local_c8 = BIND_RENDER_TARGET,
       (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.APIVersion.Minor !=
       0xffffffff)) goto LAB_002e375f;
  }
  else {
    if (RVar2 == RENDER_DEVICE_TYPE_GL) {
      uVar18 = (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.APIVersion.
               Major;
      if (uVar18 == 4) {
        uVar18 = (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.
                 APIVersion.Minor;
      }
      local_c8 = BIND_RENDER_TARGET;
      if (3 < uVar18) goto LAB_002e37a1;
    }
LAB_002e375f:
    ppcVar12 = local_48.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (local_48.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_48.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_c8 = BIND_NONE;
    }
    else {
      do {
        bVar5 = CheckExtension(this,*ppcVar12);
        if (bVar5) {
          local_c8 = BIND_RENDER_TARGET;
          goto LAB_002e37a1;
        }
        ppcVar12 = ppcVar12 + 1;
      } while (ppcVar12 !=
               local_48.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
      local_c8 = BIND_NONE;
    }
  }
LAB_002e37a1:
  if (local_48.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  msg._M_dataplus._M_p = "GL_EXT_texture_norm16";
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&msg;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&local_60,__l_00,(allocator_type *)&params);
  RVar2 = (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.Type;
  if (RVar2 == RENDER_DEVICE_TYPE_GLES) {
    if (((this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.APIVersion.Major
         != 0xffffffff) ||
       (local_cc = BIND_RENDER_TARGET,
       (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.APIVersion.Minor !=
       0xffffffff)) goto LAB_002e3831;
  }
  else if ((RVar2 != RENDER_DEVICE_TYPE_GL) ||
          (local_cc = BIND_RENDER_TARGET,
          (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.APIVersion.Major
          < 4)) {
LAB_002e3831:
    ppcVar12 = local_60.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (local_60.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_60.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_cc = BIND_NONE;
    }
    else {
      do {
        bVar5 = CheckExtension(this,*ppcVar12);
        if (bVar5) {
          local_cc = BIND_RENDER_TARGET;
          goto LAB_002e3873;
        }
        ppcVar12 = ppcVar12 + 1;
      } while (ppcVar12 !=
               local_60.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
      local_cc = BIND_NONE;
    }
  }
LAB_002e3873:
  if (local_60.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  msg._M_dataplus._M_p = "GL_EXT_render_snorm";
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&msg;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&local_78,__l_01,(allocator_type *)&params);
  RVar2 = (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.Type;
  if (RVar2 == RENDER_DEVICE_TYPE_GLES) {
    if (((this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.APIVersion.Major
         != 0xffffffff) ||
       (local_d0 = BIND_RENDER_TARGET,
       (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.APIVersion.Minor !=
       0xffffffff)) goto LAB_002e3904;
  }
  else {
    if (RVar2 == RENDER_DEVICE_TYPE_GL) {
      uVar18 = (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.APIVersion.
               Major;
      if (uVar18 == 4) {
        uVar18 = (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.
                 APIVersion.Minor;
      }
      local_d0 = BIND_RENDER_TARGET;
      if (3 < uVar18) goto LAB_002e3946;
    }
LAB_002e3904:
    ppcVar12 = local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_d0 = BIND_NONE;
    }
    else {
      do {
        bVar5 = CheckExtension(this,*ppcVar12);
        if (bVar5) {
          local_d0 = BIND_RENDER_TARGET;
          goto LAB_002e3946;
        }
        ppcVar12 = ppcVar12 + 1;
      } while (ppcVar12 !=
               local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
      local_d0 = BIND_NONE;
    }
  }
LAB_002e3946:
  if (local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  msg._M_dataplus._M_p = "GL_EXT_color_buffer_half_float";
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&msg;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&local_90,__l_02,(allocator_type *)&params);
  RVar2 = (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.Type;
  if (RVar2 == RENDER_DEVICE_TYPE_GLES) {
    uVar18 = (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.APIVersion.
             Major;
    bVar5 = 2 < uVar18;
    if (uVar18 == 3) {
      bVar5 = 1 < (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.
                  APIVersion.Minor;
    }
    BVar16 = BIND_RENDER_TARGET;
    if (!bVar5) goto LAB_002e39d1;
  }
  else if ((RVar2 != RENDER_DEVICE_TYPE_GL) ||
          (BVar16 = BIND_RENDER_TARGET,
          (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.APIVersion.Major
          < 4)) {
LAB_002e39d1:
    ppcVar12 = local_90.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (local_90.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_90.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      BVar16 = BIND_NONE;
    }
    else {
      do {
        bVar5 = CheckExtension(this,*ppcVar12);
        if (bVar5) {
          BVar16 = BIND_RENDER_TARGET;
          goto LAB_002e3a04;
        }
        ppcVar12 = ppcVar12 + 1;
      } while (ppcVar12 !=
               local_90.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
      BVar16 = BIND_NONE;
    }
  }
LAB_002e3a04:
  if (local_90.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_90.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  msg._M_dataplus._M_p = "GL_EXT_color_buffer_float";
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)&msg;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&local_a8,__l_03,(allocator_type *)&params);
  RVar2 = (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.Type;
  if (RVar2 == RENDER_DEVICE_TYPE_GLES) {
    uVar18 = (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.APIVersion.
             Major;
    bVar5 = 2 < uVar18;
    if (uVar18 == 3) {
      bVar5 = 1 < (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.
                  APIVersion.Minor;
    }
    BVar17 = BIND_RENDER_TARGET;
    if (!bVar5) goto LAB_002e3a8c;
  }
  else if ((RVar2 != RENDER_DEVICE_TYPE_GL) ||
          (BVar17 = BIND_RENDER_TARGET,
          (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.APIVersion.Major
          < 4)) {
LAB_002e3a8c:
    ppcVar12 = local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      BVar17 = BIND_NONE;
    }
    else {
      do {
        bVar5 = CheckExtension(this,*ppcVar12);
        if (bVar5) {
          BVar17 = BIND_RENDER_TARGET;
          goto LAB_002e3abf;
        }
        ppcVar12 = ppcVar12 + 1;
      } while (ppcVar12 !=
               local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
      BVar17 = BIND_NONE;
    }
  }
LAB_002e3abf:
  uVar18 = (uint)bVar20;
  BVar1 = uVar18 * 0x80 + BIND_SHADER_RESOURCE;
  if (local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  BVar19 = uVar18 * 0x80 | (BIND_RENDER_TARGET|BIND_SHADER_RESOURCE);
  local_c8 = local_c8 | BVar1;
  BVar16 = BVar16 | BVar1;
  BVar17 = BVar17 | BVar1;
  RVar2 = (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.Type;
  if (RVar2 == RENDER_DEVICE_TYPE_GLES) {
    uVar18 = (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.APIVersion.
             Major;
    bVar5 = 2 < uVar18;
    if (uVar18 == 3) {
      bVar5 = 1 < (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.
                  APIVersion.Minor;
    }
    BVar14 = BIND_RENDER_TARGET;
    if (bVar5) goto LAB_002e3b2c;
  }
  else if ((RVar2 == RENDER_DEVICE_TYPE_GL) &&
          (BVar14 = BIND_RENDER_TARGET,
          3 < (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.APIVersion.
              Major)) goto LAB_002e3b2c;
  BVar14 = BIND_NONE;
LAB_002e3b2c:
  BVar15 = local_d0 | BVar1;
  BVar4 = local_cc | BVar1;
  if ((Bool)uVar24 == false) {
    BVar15 = BIND_NONE;
    BVar4 = BIND_NONE;
  }
  bVar5 = (int)local_b8 == 3;
  pvVar13 = (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_TextureFormatsInfo.
            super__Vector_base<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar13[1].super_TextureFormatInfo.Supported = true;
  pvVar13[1].BindFlags = BIND_NONE;
  pvVar13[1].Filterable = false;
  pvVar13[2].super_TextureFormatInfo.Supported = true;
  pvVar13[2].BindFlags = BVar17;
  pvVar13[2].Filterable = bVar5;
  pvVar13[3].super_TextureFormatInfo.Supported = true;
  pvVar13[3].BindFlags = BVar19;
  pvVar13[3].Filterable = false;
  pvVar13[4].super_TextureFormatInfo.Supported = true;
  pvVar13[4].BindFlags = BVar19;
  pvVar13[4].Filterable = false;
  pvVar13[5].super_TextureFormatInfo.Supported = true;
  pvVar13[5].BindFlags = BIND_NONE;
  pvVar13[5].Filterable = false;
  pvVar13[6].super_TextureFormatInfo.Supported = true;
  pvVar13[6].BindFlags = BVar17;
  pvVar13[6].Filterable = bVar5;
  pvVar13[8].super_TextureFormatInfo.Supported = true;
  pvVar13[8].BindFlags = BVar19;
  pvVar13[8].Filterable = false;
  pvVar13[7].super_TextureFormatInfo.Supported = true;
  pvVar13[7].BindFlags = BVar19;
  pvVar13[7].Filterable = false;
  pvVar13[9].super_TextureFormatInfo.Supported = true;
  pvVar13[9].BindFlags = BIND_NONE;
  pvVar13[9].Filterable = false;
  pvVar13[10].super_TextureFormatInfo.Supported = true;
  pvVar13[10].BindFlags = BVar16;
  pvVar13[10].Filterable = true;
  pvVar13[0xb].super_TextureFormatInfo.Supported = (Bool)uVar24;
  pvVar13[0xb].BindFlags = BVar4;
  pvVar13[0xb].Filterable = (Bool)uVar24;
  pvVar13[0xc].super_TextureFormatInfo.Supported = true;
  pvVar13[0xc].BindFlags = BVar19;
  pvVar13[0xc].Filterable = false;
  pvVar13[0xd].super_TextureFormatInfo.Supported = (Bool)uVar24;
  pvVar13[0xd].BindFlags = BVar15;
  pvVar13[0xd].Filterable = (Bool)uVar24;
  pvVar13[0xe].super_TextureFormatInfo.Supported = true;
  pvVar13[0xe].BindFlags = BVar19;
  pvVar13[0xe].Filterable = false;
  pvVar13[0xf].super_TextureFormatInfo.Supported = true;
  pvVar13[0xf].BindFlags = BIND_NONE;
  pvVar13[0xf].Filterable = false;
  pvVar13[0x10].super_TextureFormatInfo.Supported = true;
  pvVar13[0x10].BindFlags = BVar17;
  pvVar13[0x10].Filterable = bVar5;
  pvVar13[0x12].super_TextureFormatInfo.Supported = true;
  pvVar13[0x12].BindFlags = BVar19;
  pvVar13[0x12].Filterable = false;
  pvVar13[0x11].super_TextureFormatInfo.Supported = true;
  pvVar13[0x11].BindFlags = BVar19;
  pvVar13[0x11].Filterable = false;
  pvVar13[0x13].super_TextureFormatInfo.Supported = true;
  pvVar13[0x13].BindFlags = BIND_NONE;
  pvVar13[0x13].Filterable = false;
  pvVar13[0x14].super_TextureFormatInfo.Supported = true;
  pvVar13[0x14].BindFlags = BIND_DEPTH_STENCIL;
  pvVar13[0x14].Filterable = false;
  pvVar13[0x15].super_TextureFormatInfo.Supported = true;
  pvVar13[0x15].BindFlags = BVar1;
  pvVar13[0x15].Filterable = bVar5;
  pvVar13[0x16].super_TextureFormatInfo.Supported = false;
  pvVar13[0x16].BindFlags = BIND_NONE;
  pvVar13[0x16].Filterable = false;
  pvVar13[0x17].super_TextureFormatInfo.Supported = true;
  pvVar13[0x17].BindFlags = BIND_NONE;
  pvVar13[0x17].Filterable = false;
  pvVar13[0x18].super_TextureFormatInfo.Supported = true;
  pvVar13[0x18].BindFlags = BVar19;
  pvVar13[0x18].Filterable = true;
  pvVar13[0x19].super_TextureFormatInfo.Supported = true;
  pvVar13[0x19].BindFlags = BVar19;
  pvVar13[0x19].Filterable = false;
  pvVar13[0x1a].super_TextureFormatInfo.Supported = true;
  pvVar13[0x1a].BindFlags = BVar14 | BVar1;
  pvVar13[0x1a].Filterable = true;
  pvVar13[0x1b].super_TextureFormatInfo.Supported = true;
  pvVar13[0x1b].BindFlags = BIND_NONE;
  pvVar13[0x1b].Filterable = false;
  pvVar13[0x1c].super_TextureFormatInfo.Supported = true;
  pvVar13[0x1c].BindFlags = BVar19;
  pvVar13[0x1c].Filterable = true;
  pvVar13[0x1d].super_TextureFormatInfo.Supported = true;
  pvVar13[0x1d].BindFlags = BVar19;
  pvVar13[0x1d].Filterable = true;
  pvVar13[0x1e].super_TextureFormatInfo.Supported = true;
  pvVar13[0x1e].BindFlags = BVar19;
  pvVar13[0x1e].Filterable = false;
  pvVar13[0x1f].super_TextureFormatInfo.Supported = true;
  pvVar13[0x1f].BindFlags = local_c8;
  pvVar13[0x1f].Filterable = true;
  pvVar13[0x20].super_TextureFormatInfo.Supported = true;
  pvVar13[0x20].BindFlags = BVar19;
  pvVar13[0x20].Filterable = false;
  pvVar13[0x21].super_TextureFormatInfo.Supported = true;
  pvVar13[0x21].BindFlags = BIND_NONE;
  pvVar13[0x21].Filterable = false;
  pvVar13[0x22].super_TextureFormatInfo.Supported = true;
  pvVar13[0x22].BindFlags = BVar16;
  pvVar13[0x22].Filterable = true;
  pvVar13 = (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_TextureFormatsInfo.
            super__Vector_base<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar13[0x23].super_TextureFormatInfo.Supported = (Bool)uVar24;
  pvVar13[0x23].BindFlags = BVar4;
  pvVar13[0x23].Filterable = (Bool)uVar24;
  pvVar13[0x24].super_TextureFormatInfo.Supported = true;
  pvVar13[0x24].BindFlags = BVar19;
  pvVar13[0x24].Filterable = false;
  pvVar13[0x25].super_TextureFormatInfo.Supported = (Bool)uVar24;
  pvVar13[0x25].BindFlags = BVar15;
  pvVar13[0x25].Filterable = (Bool)uVar24;
  pvVar13[0x26].super_TextureFormatInfo.Supported = true;
  pvVar13[0x26].BindFlags = BVar19;
  pvVar13[0x26].Filterable = false;
  pvVar13[0x27].super_TextureFormatInfo.Supported = true;
  pvVar13[0x27].BindFlags = BIND_NONE;
  pvVar13[0x27].Filterable = false;
  pvVar13[0x28].super_TextureFormatInfo.Supported = true;
  pvVar13[0x28].BindFlags = BIND_DEPTH_STENCIL;
  pvVar13[0x28].Filterable = false;
  pvVar13[0x29].super_TextureFormatInfo.Supported = true;
  pvVar13[0x29].BindFlags = BVar17;
  pvVar13[0x29].Filterable = bVar5;
  pvVar13[0x2a].super_TextureFormatInfo.Supported = true;
  pvVar13[0x2a].BindFlags = BVar19;
  pvVar13[0x2a].Filterable = false;
  pvVar13[0x2b].super_TextureFormatInfo.Supported = true;
  pvVar13[0x2b].BindFlags = BVar19;
  pvVar13[0x2b].Filterable = false;
  pvVar13[0x2c].super_TextureFormatInfo.Supported = true;
  pvVar13[0x2c].BindFlags = BIND_NONE;
  pvVar13[0x2c].Filterable = false;
  pvVar13[0x2d].super_TextureFormatInfo.Supported = true;
  pvVar13[0x2d].BindFlags = BIND_DEPTH_STENCIL;
  pvVar13[0x2d].Filterable = false;
  pvVar13[0x2e].super_TextureFormatInfo.Supported = true;
  pvVar13[0x2e].BindFlags = BVar1;
  pvVar13[0x2e].Filterable = true;
  pvVar13[0x2f].super_TextureFormatInfo.Supported = false;
  pvVar13[0x2f].BindFlags = BIND_NONE;
  pvVar13[0x2f].Filterable = false;
  pvVar13[0x30].super_TextureFormatInfo.Supported = true;
  pvVar13[0x30].BindFlags = BIND_NONE;
  pvVar13[0x30].Filterable = false;
  pvVar13[0x31].super_TextureFormatInfo.Supported = true;
  pvVar13[0x31].BindFlags = BVar19;
  pvVar13[0x31].Filterable = true;
  pvVar13[0x32].super_TextureFormatInfo.Supported = true;
  pvVar13[0x32].BindFlags = BVar19;
  pvVar13[0x32].Filterable = false;
  pvVar13[0x33].super_TextureFormatInfo.Supported = true;
  pvVar13[0x33].BindFlags = local_c8;
  pvVar13[0x33].Filterable = true;
  pvVar13[0x34].super_TextureFormatInfo.Supported = true;
  pvVar13[0x34].BindFlags = BVar19;
  pvVar13[0x34].Filterable = false;
  pvVar13[0x35].super_TextureFormatInfo.Supported = true;
  pvVar13[0x35].BindFlags = BIND_NONE;
  pvVar13[0x35].Filterable = false;
  pvVar13[0x36].super_TextureFormatInfo.Supported = true;
  pvVar13[0x36].BindFlags = BVar16;
  pvVar13[0x36].Filterable = true;
  pvVar13[0x37].super_TextureFormatInfo.Supported = true;
  pvVar13[0x37].BindFlags = BIND_DEPTH_STENCIL;
  pvVar13[0x37].Filterable = false;
  pvVar13[0x38].super_TextureFormatInfo.Supported = (Bool)uVar24;
  pvVar13[0x38].BindFlags = BVar4;
  pvVar13[0x38].Filterable = (Bool)uVar24;
  pvVar13[0x39].super_TextureFormatInfo.Supported = true;
  pvVar13[0x39].BindFlags = BVar19;
  pvVar13[0x39].Filterable = false;
  pvVar13[0x3a].super_TextureFormatInfo.Supported = (Bool)uVar24;
  pvVar13[0x3a].BindFlags = BVar15;
  pvVar13[0x3a].Filterable = (Bool)uVar24;
  pvVar13[0x3b].super_TextureFormatInfo.Supported = true;
  pvVar13[0x3b].BindFlags = BVar19;
  pvVar13[0x3b].Filterable = false;
  pvVar13[0x3c].super_TextureFormatInfo.Supported = true;
  pvVar13[0x3c].BindFlags = BIND_NONE;
  pvVar13[0x3c].Filterable = false;
  pvVar13[0x3d].super_TextureFormatInfo.Supported = true;
  pvVar13[0x3d].BindFlags = BVar19;
  pvVar13[0x3d].Filterable = true;
  pvVar13[0x3e].super_TextureFormatInfo.Supported = true;
  pvVar13[0x3e].BindFlags = BVar19;
  pvVar13[0x3e].Filterable = false;
  pvVar13[0x3f].super_TextureFormatInfo.Supported = true;
  pvVar13[0x3f].BindFlags = local_c8;
  pvVar13[0x3f].Filterable = true;
  pvVar13[0x40].super_TextureFormatInfo.Supported = true;
  pvVar13[0x40].BindFlags = BVar19;
  pvVar13[0x40].Filterable = false;
  pvVar13[0x41].super_TextureFormatInfo.Supported = (Bool)uVar22;
  if ((Bool)uVar22 == false) {
    BVar19 = BIND_NONE;
  }
  pvVar13[0x41].BindFlags = BVar19;
  pvVar13[0x41].Filterable = (Bool)uVar22;
  pvVar13[0x42].super_TextureFormatInfo.Supported = false;
  pvVar13[0x42].BindFlags = BIND_NONE;
  pvVar13[0x42].Filterable = false;
  pvVar13[0x43].super_TextureFormatInfo.Supported = true;
  pvVar13[0x43].BindFlags = BIND_SHADER_RESOURCE;
  pvVar13[0x43].Filterable = true;
  pvVar13[0x44].super_TextureFormatInfo.Supported = false;
  pvVar13[0x44].BindFlags = BIND_NONE;
  pvVar13[0x44].Filterable = false;
  pvVar13 = (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_TextureFormatsInfo.
            super__Vector_base<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar13[0x45].super_TextureFormatInfo.Supported = false;
  pvVar13[0x45].BindFlags = BIND_NONE;
  pvVar13[0x45].Filterable = false;
  pvVar13[0x46].super_TextureFormatInfo.Supported = (Bool)uVar8;
  pvVar13[0x46].BindFlags = BIND_NONE;
  pvVar13[0x46].Filterable = false;
  pvVar13[0x47].super_TextureFormatInfo.Supported = (Bool)uVar8;
  BVar16 = (uint)(byte)uVar8 * 8;
  pvVar13[0x47].BindFlags = BVar16;
  pvVar13[0x47].Filterable = (Bool)uVar8;
  pvVar13[0x48].super_TextureFormatInfo.Supported = (Bool)uVar8;
  pvVar13[0x48].BindFlags = BVar16;
  pvVar13[0x48].Filterable = (Bool)uVar8;
  pvVar13[0x49].super_TextureFormatInfo.Supported = (Bool)uVar8;
  pvVar13[0x49].BindFlags = BIND_NONE;
  pvVar13[0x49].Filterable = false;
  pvVar13[0x4a].super_TextureFormatInfo.Supported = (Bool)uVar8;
  pvVar13[0x4a].BindFlags = BVar16;
  pvVar13[0x4a].Filterable = (Bool)uVar8;
  pvVar13[0x4b].super_TextureFormatInfo.Supported = (Bool)uVar8;
  pvVar13[0x4b].BindFlags = BVar16;
  pvVar13[0x4b].Filterable = (Bool)uVar8;
  pvVar13[0x4c].super_TextureFormatInfo.Supported = (Bool)uVar8;
  pvVar13[0x4c].BindFlags = BIND_NONE;
  pvVar13[0x4c].Filterable = false;
  pvVar13[0x4d].super_TextureFormatInfo.Supported = (Bool)uVar8;
  pvVar13[0x4d].BindFlags = BVar16;
  pvVar13[0x4d].Filterable = (Bool)uVar8;
  pvVar13[0x4e].super_TextureFormatInfo.Supported = (Bool)uVar8;
  pvVar13[0x4e].BindFlags = BVar16;
  pvVar13[0x4e].Filterable = (Bool)uVar8;
  pvVar13[0x4f].super_TextureFormatInfo.Supported = (Bool)uVar6;
  pvVar13[0x4f].BindFlags = BIND_NONE;
  pvVar13[0x4f].Filterable = false;
  pvVar13[0x50].super_TextureFormatInfo.Supported = (Bool)uVar6;
  BVar16 = (uint)(byte)uVar6 * 8;
  pvVar13[0x50].BindFlags = BVar16;
  pvVar13[0x50].Filterable = (Bool)uVar6;
  pvVar13[0x51].super_TextureFormatInfo.Supported = (Bool)uVar6;
  pvVar13[0x51].BindFlags = BVar16;
  pvVar13[0x51].Filterable = (Bool)uVar6;
  pvVar13[0x52].super_TextureFormatInfo.Supported = (Bool)uVar6;
  pvVar13[0x52].BindFlags = BIND_NONE;
  pvVar13[0x52].Filterable = false;
  pvVar13[0x53].super_TextureFormatInfo.Supported = (Bool)uVar6;
  pvVar13[0x53].BindFlags = BVar16;
  pvVar13[0x53].Filterable = (Bool)uVar6;
  pvVar13[0x54].super_TextureFormatInfo.Supported = (Bool)uVar6;
  pvVar13[0x54].BindFlags = BVar16;
  pvVar13[0x54].Filterable = (Bool)uVar6;
  pvVar13[0x55].super_TextureFormatInfo.Supported = false;
  pvVar13[0x55].BindFlags = BIND_NONE;
  pvVar13[0x55].Filterable = false;
  pvVar13[0x56].super_TextureFormatInfo.Supported = false;
  pvVar13[0x56].BindFlags = BIND_NONE;
  pvVar13[0x56].Filterable = false;
  pvVar13[0x57].super_TextureFormatInfo.Supported = (Bool)uVar22;
  pvVar13[0x57].BindFlags = (uint)(byte)uVar22 * 8;
  pvVar13[0x57].Filterable = (Bool)uVar22;
  pvVar13[0x58].super_TextureFormatInfo.Supported = false;
  pvVar13[0x58].BindFlags = BIND_NONE;
  pvVar13[0x58].Filterable = false;
  pvVar13[0x59].super_TextureFormatInfo.Supported = false;
  pvVar13[0x59].BindFlags = BIND_NONE;
  pvVar13[0x59].Filterable = false;
  pvVar13[0x5a].super_TextureFormatInfo.Supported = false;
  pvVar13[0x5a].BindFlags = BIND_NONE;
  pvVar13[0x5a].Filterable = false;
  pvVar13[0x5b].super_TextureFormatInfo.Supported = false;
  pvVar13[0x5b].BindFlags = BIND_NONE;
  pvVar13[0x5b].Filterable = false;
  pvVar13[0x5c].super_TextureFormatInfo.Supported = false;
  pvVar13[0x5c].BindFlags = BIND_NONE;
  pvVar13[0x5c].Filterable = false;
  pvVar13[0x5d].super_TextureFormatInfo.Supported = false;
  pvVar13[0x5d].BindFlags = BIND_NONE;
  pvVar13[0x5d].Filterable = false;
  pvVar13[0x5e].super_TextureFormatInfo.Supported = (Bool)uVar7;
  pvVar13[0x5e].BindFlags = BIND_NONE;
  pvVar13[0x5e].Filterable = false;
  pvVar13[0x5f].super_TextureFormatInfo.Supported = (Bool)uVar7;
  BVar16 = (uint)(byte)uVar7 * 8;
  pvVar13[0x5f].BindFlags = BVar16;
  pvVar13[0x5f].Filterable = (Bool)uVar7;
  pvVar13[0x60].super_TextureFormatInfo.Supported = (Bool)uVar7;
  pvVar13[0x60].BindFlags = BVar16;
  pvVar13[0x60].Filterable = (Bool)uVar7;
  pvVar13[0x61].super_TextureFormatInfo.Supported = (Bool)uVar7;
  pvVar13[0x61].BindFlags = BIND_NONE;
  pvVar13[0x61].Filterable = false;
  pvVar13[0x62].super_TextureFormatInfo.Supported = (Bool)uVar7;
  pvVar13[0x62].BindFlags = BVar16;
  pvVar13[0x62].Filterable = (Bool)uVar7;
  pvVar13[99].super_TextureFormatInfo.Supported = (Bool)uVar7;
  pvVar13[99].BindFlags = BVar16;
  pvVar13[99].Filterable = (Bool)uVar7;
  pvVar13[100].super_TextureFormatInfo.Supported = (Bool)uVar23;
  BVar16 = (uint)(byte)uVar23 * 8;
  pvVar13[100].BindFlags = BVar16;
  pvVar13[100].Filterable = (Bool)uVar23;
  pvVar13[0x65].super_TextureFormatInfo.Supported = (Bool)uVar23;
  pvVar13[0x65].BindFlags = BVar16;
  pvVar13[0x65].Filterable = (Bool)uVar23;
  pvVar13[0x66].super_TextureFormatInfo.Supported = (Bool)uVar23;
  pvVar13[0x66].BindFlags = BVar16;
  pvVar13[0x66].Filterable = (Bool)uVar23;
  pvVar13 = (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_TextureFormatsInfo.
            super__Vector_base<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar13[0x67].super_TextureFormatInfo.Supported = (Bool)uVar23;
  pvVar13[0x67].BindFlags = BVar16;
  pvVar13[0x67].Filterable = (Bool)uVar23;
  pvVar13[0x68].super_TextureFormatInfo.Supported = (Bool)uVar23;
  pvVar13[0x68].BindFlags = BVar16;
  pvVar13[0x68].Filterable = (Bool)uVar23;
  pvVar13[0x69].super_TextureFormatInfo.Supported = (Bool)uVar23;
  pvVar13[0x69].BindFlags = BVar16;
  pvVar13[0x69].Filterable = (Bool)uVar23;
  bVar5 = false;
  if ((this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.Type ==
      RENDER_DEVICE_TYPE_GL) {
    uVar18 = (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.APIVersion.
             Major;
    bVar5 = 3 < uVar18;
    if (uVar18 == 4) {
      bVar5 = 2 < (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.
                  APIVersion.Minor;
    }
  }
  TestTextureDim = 8;
  local_b8 = operator_new(0x400);
  memset(local_b8,0,0x400);
  pvVar13 = (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_TextureFormatsInfo.
            super__Vector_base<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_TextureFormatsInfo.
           super__Vector_base<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pvVar13 == pvVar3) {
      operator_delete(local_b8,0x400);
      return;
    }
    TexFormat = (pvVar13->super_TextureFormatInfo).super_TextureFormatAttribs.Format;
    if (TexFormat != TEX_FORMAT_UNKNOWN) {
      GVar9 = TexFormatToGLInternalTexFormat(TexFormat,0);
      if (GVar9 == 0) {
        if ((pvVar13->super_TextureFormatInfo).Supported == true) {
          FormatString<char[39]>(&msg,(char (*) [39])"Format should be marked as unsupported");
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"FlagSupportedTexFormats",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/RenderDeviceGLImpl.cpp"
                     ,0x549);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
          }
        }
      }
      else {
        if (bVar5) {
          params = 0;
          (*__glewGetInternalformativ)(0xde1,GVar9,0x826f,1,&params);
          err = glGetError();
          if (err != 0) {
            LogError<false,char[31],char[17],unsigned_int>
                      (false,"FlagSupportedTexFormats",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/RenderDeviceGLImpl.cpp"
                       ,0x553,(char (*) [31])"glGetInternalformativ() failed",
                       (char (*) [17])"\nGL Error Code: ",&err);
            FormatString<char[6]>(&msg,(char (*) [6])0x8506c9);
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"FlagSupportedTexFormats",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/RenderDeviceGLImpl.cpp"
                       ,0x553);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
          }
          if ((pvVar13->super_TextureFormatInfo).Supported != (params == 1)) {
            FormatString<char[41]>(&msg,(char (*) [41])"This internal format should be supported");
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"FlagSupportedTexFormats",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/RenderDeviceGLImpl.cpp"
                       ,0x554);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
          }
        }
        if ((((pvVar13->super_TextureFormatInfo).Supported == true) &&
            (1 < (byte)((pvVar13->super_TextureFormatInfo).super_TextureFormatAttribs.ComponentType
                       - COMPONENT_TYPE_DEPTH))) &&
           ((pvVar13->super_TextureFormatInfo).super_TextureFormatAttribs.IsTypeless == false)) {
          GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper>::
          GLObjWrapper((GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper> *)&params,true,
                       (GLTextureCreateReleaseHelper)0x0);
          glBindTexture(0xde1,params);
          err = glGetError();
          if (err != 0) {
            LogError<false,char[23],char[17],unsigned_int>
                      (false,"FlagSupportedTexFormats",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/RenderDeviceGLImpl.cpp"
                       ,0x560,(char (*) [23])"Failed to bind texture",
                       (char (*) [17])"\nGL Error Code: ",&err);
            FormatString<char[6]>(&msg,(char (*) [6])0x8506c9);
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"FlagSupportedTexFormats",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/RenderDeviceGLImpl.cpp"
                       ,0x560);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
          }
          (*__glewTexStorage2D)(0xde1,1,GVar9,8,8);
          iVar10 = glGetError();
          if (iVar10 == 0) {
            NVar21 = GetNativePixelTransferAttribs
                               ((pvVar13->super_TextureFormatInfo).super_TextureFormatAttribs.Format
                               );
            if (((undefined1  [12])NVar21 & (undefined1  [12])0x1) == (undefined1  [12])0x0) {
              glTexSubImage2D(0xde1,0,0,0,8,8,NVar21._0_8_,NVar21._0_8_ >> 0x20,local_b8);
            }
            else {
              pTVar11 = GetTextureFormatAttribs
                                  ((pvVar13->super_TextureFormatInfo).super_TextureFormatAttribs.
                                   Format);
              (*__glewCompressedTexSubImage2D)
                        (0xde1,0,0,0,8,8,GVar9,
                         (uint)(8 / pTVar11->BlockHeight) *
                         (uint)pTVar11->ComponentSize * (int)(8 / pTVar11->BlockWidth),local_b8);
            }
            iVar10 = glGetError();
            if (iVar10 != 0) {
              FormatString<char[33],int,char[2],int,char[2],char_const*,char[106]>
                        (&msg,(Diligent *)"Failed to upload data to a test ",
                         (char (*) [33])&TestTextureDim,(int *)0x91ed00,
                         (char (*) [2])&TestTextureDim,(int *)0x8fd755,(char (*) [2])pvVar13,
                         (char **)
                         " texture. This likely indicates that the format is not supported despite being reported so by the device."
                         ,(char (*) [106])
                          CONCAT17(uVar7,CONCAT16(uVar6,CONCAT15(uVar8,CONCAT14(bVar20,CONCAT13(
                                                  uVar24,CONCAT12(uVar23,CONCAT11(uVar22,
                                                  in_stack_ffffffffffffff08))))))));
              if (DebugMessageCallback != (undefined *)0x0) {
                (*(code *)DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0,0);
              }
              goto LAB_002e47e4;
            }
          }
          else {
            FormatString<char[39],int,char[2],int,char[2],char_const*,char[106]>
                      (&msg,(Diligent *)"Failed to allocate storage for a test ",
                       (char (*) [39])&TestTextureDim,(int *)0x91ed00,(char (*) [2])&TestTextureDim,
                       (int *)0x8fd755,(char (*) [2])pvVar13,
                       (char **)
                       " texture. This likely indicates that the format is not supported despite being reported so by the device."
                       ,(char (*) [106])
                        CONCAT17(uVar7,CONCAT16(uVar6,CONCAT15(uVar8,CONCAT14(bVar20,CONCAT13(uVar24
                                                  ,CONCAT12(uVar23,CONCAT11(uVar22,
                                                  in_stack_ffffffffffffff08))))))));
            if (DebugMessageCallback != (undefined *)0x0) {
              (*(code *)DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0,0);
            }
LAB_002e47e4:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
            (pvVar13->super_TextureFormatInfo).Supported = false;
          }
          glBindTexture(0xde1);
          if (params != 0) {
            msg._M_dataplus._M_p._0_4_ = params;
            if (local_c0.m_ExternalGLTextureHandle == 0) {
              glDeleteTextures(1);
            }
          }
        }
      }
    }
    pvVar13 = pvVar13 + 1;
  } while( true );
}

Assistant:

void RenderDeviceGLImpl::FlagSupportedTexFormats()
{
    const auto& DeviceInfo     = GetDeviceInfo();
    const auto  bDekstopGL     = DeviceInfo.Type == RENDER_DEVICE_TYPE_GL;
    const auto  bGLES30OrAbove = DeviceInfo.Type == RENDER_DEVICE_TYPE_GLES && DeviceInfo.APIVersion >= Version{3, 0};

    const bool bRGTC       = CheckExtension("GL_EXT_texture_compression_rgtc") || CheckExtension("GL_ARB_texture_compression_rgtc");
    const bool bBPTC       = CheckExtension("GL_EXT_texture_compression_bptc") || CheckExtension("GL_ARB_texture_compression_bptc");
    const bool bS3TC       = CheckExtension("GL_EXT_texture_compression_s3tc") || CheckExtension("GL_WEBGL_compressed_texture_s3tc");
    const bool bTexNorm16  = bDekstopGL || CheckExtension("GL_EXT_texture_norm16"); // Only for ES3.1+
    const bool bTexSwizzle = bDekstopGL || bGLES30OrAbove || CheckExtension("GL_ARB_texture_swizzle");

#if PLATFORM_WEB
    const bool bETC2 = CheckExtension("GL_WEBGL_compressed_texture_etc");
#else
    const bool bETC2 = bGLES30OrAbove || CheckExtension("GL_ARB_ES3_compatibility");
#endif

    //              ||   GLES3.0   ||            GLES3.1              ||            GLES3.2              ||
    // |   Format   ||  CR  |  TF  ||  CR  |  TF  | Req RB | Req. Tex ||  CR  |  TF  | Req RB | Req. Tex ||
    // |------------||------|------||------|------|--------|----------||------|------|--------|----------||
    // |     U8     ||  V   |  V   ||  V   |  V   |   V    |    V     ||  V   |  V   |   V    |    V     ||
    // |     S8     ||      |  V   ||      |  V   |        |    V     ||      |  V   |        |    V     ||
    // |  SRGBA8    ||  V   |  V   ||  V   |  V   |   V    |    V     ||  V   |  V   |   V    |    V     ||
    // |    UI8     ||  V   |      ||  V   |      |   V    |    V     ||  V   |      |   V    |    V     ||
    // |    SI8     ||  V   |      ||  V   |      |   V    |    V     ||  V   |      |   V    |    V     ||
    // |    U16     ||  -   |  -   ||  -   |  -   |   -    |    -     ||  -   |  -   |   -    |    -     ||
    // |    S16     ||  -   |  -   ||  -   |  -   |   -    |    -     ||  -   |  -   |   -    |    -     ||
    // |   UI16     ||  V   |      ||  V   |      |   V    |    V     ||  V   |      |   V    |    V     ||
    // |   SI16     ||  V   |      ||  V   |      |   V    |    V     ||  V   |      |   V    |    V     ||
    // |   UI32     ||  V   |      ||  V   |      |   V    |    V     ||  V   |      |   V    |    V     ||
    // |   SI32     ||  V   |      ||  V   |      |   V    |    V     ||  V   |      |   V    |    V     ||
    // |    F16     ||      |  V   ||      |  V   |        |    V     || +V   |  V   |  +V    |    V     ||
    // |    F32     ||      |      ||      |      |        |    V     || +V   |      |  +V    |    V     ||
    // |  RGB10A2   ||  V   |  V   ||  V   |  V   |   V    |    V     ||  V   |  V   |   V    |    V     ||
    // | RGB10A2UI  ||  V   |      ||  V   |      |   V    |    V     ||  V   |      |   V    |    V     ||
    // | R11G11B10F ||      |  V   ||      |  V   |        |    V     || +V   |  V   |   V    |    V     ||
    // |  RGB9_E5   ||      |      ||      |  V   |        |    V     ||      |  V   |        |    V     ||

    // CR (Color Renderable)          - texture can be used as color attachment
    // TF (Texture Filterable)        - texture can be filtered (mipmapping and minification/magnification filtering)
    // Req RB (Required Renderbuffer) - texture supports renderbuffer usage
    // Req. Tex (Required Texture)    - texture usage is supported

    static constexpr Version NotAvaiable = Version{~0u, ~0u};

    auto CheckBindFlagSupport = [&](BIND_FLAGS                     BindFlag,
                                    const Version&                 MinGLVersion,
                                    const Version&                 MinGLESVersion = Version{~0u, ~0u},
                                    const std::vector<const char*> Extensions     = {}) {
        if (DeviceInfo.Type == RENDER_DEVICE_TYPE_GL && DeviceInfo.APIVersion >= MinGLVersion)
            return BindFlag;

        if (DeviceInfo.Type == RENDER_DEVICE_TYPE_GLES && DeviceInfo.APIVersion >= MinGLESVersion)
            return BindFlag;

        for (const auto* Ext : Extensions)
        {
            if (CheckExtension(Ext))
                return BindFlag;
        }

        return BIND_NONE;
    };

    const BIND_FLAGS TexBindFlags =
        BIND_SHADER_RESOURCE |
        (m_DeviceInfo.Features.PixelUAVWritesAndAtomics ? BIND_UNORDERED_ACCESS : BIND_NONE);

    BIND_FLAGS U8BindFlags         = TexBindFlags | BIND_RENDER_TARGET;
    BIND_FLAGS SRGBA8BindFlags     = TexBindFlags | BIND_RENDER_TARGET;
    BIND_FLAGS S8BindFlags         = TexBindFlags | CheckBindFlagSupport(BIND_RENDER_TARGET, {4, 4}, NotAvaiable, {"GL_EXT_render_snorm"});
    BIND_FLAGS UI8BindFlags        = TexBindFlags | BIND_RENDER_TARGET;
    BIND_FLAGS SI8BindFlags        = TexBindFlags | BIND_RENDER_TARGET;
    BIND_FLAGS U16BindFlags        = TexBindFlags | CheckBindFlagSupport(BIND_RENDER_TARGET, {4, 0}, NotAvaiable, {"GL_EXT_texture_norm16"});
    BIND_FLAGS S16BindFlags        = TexBindFlags | CheckBindFlagSupport(BIND_RENDER_TARGET, {4, 4}, NotAvaiable, {"GL_EXT_render_snorm"});
    BIND_FLAGS UI16BindFlags       = TexBindFlags | BIND_RENDER_TARGET;
    BIND_FLAGS SI16BindFlags       = TexBindFlags | BIND_RENDER_TARGET;
    BIND_FLAGS UI32BindFlags       = TexBindFlags | BIND_RENDER_TARGET;
    BIND_FLAGS SI32BindFlags       = TexBindFlags | BIND_RENDER_TARGET;
    BIND_FLAGS F16BindFlags        = TexBindFlags | CheckBindFlagSupport(BIND_RENDER_TARGET, {4, 0}, {3, 2}, {"GL_EXT_color_buffer_half_float"});
    BIND_FLAGS F32BindFlags        = TexBindFlags | CheckBindFlagSupport(BIND_RENDER_TARGET, {4, 0}, {3, 2}, {"GL_EXT_color_buffer_float"});
    BIND_FLAGS R11G11B10FBindFlags = TexBindFlags | CheckBindFlagSupport(BIND_RENDER_TARGET, {4, 0}, {3, 2});
    BIND_FLAGS BindSrvRtvUav       = TexBindFlags | BIND_RENDER_TARGET;

    auto FlagFormat = [this](TEXTURE_FORMAT Fmt, bool Supported, BIND_FLAGS BindFlags = BIND_NONE, bool Filterable = false) {
        TextureFormatInfoExt& FmtInfo = m_TextureFormatsInfo[Fmt];

        FmtInfo.Supported  = Supported;
        FmtInfo.BindFlags  = Supported ? BindFlags : BIND_NONE;
        FmtInfo.Filterable = Supported && Filterable;
    };

    // The formats marked by true below are required in GL 3.3+ and GLES 3.0+
    // Note that GLES2.0 does not specify any required formats

    // clang-format off
    //               Format                           Supported     BindFlags       Filterable
    FlagFormat(TEX_FORMAT_RGBA32_TYPELESS,            true                                      );
    FlagFormat(TEX_FORMAT_RGBA32_FLOAT,               true,         F32BindFlags,     bDekstopGL);
    FlagFormat(TEX_FORMAT_RGBA32_UINT,                true,         UI32BindFlags               );
    FlagFormat(TEX_FORMAT_RGBA32_SINT,                true,         SI32BindFlags               );
    FlagFormat(TEX_FORMAT_RGB32_TYPELESS,             true                                      );
    FlagFormat(TEX_FORMAT_RGB32_FLOAT,                true,         F32BindFlags,     bDekstopGL);
    FlagFormat(TEX_FORMAT_RGB32_SINT,                 true,         SI32BindFlags               );
    FlagFormat(TEX_FORMAT_RGB32_UINT,                 true,         UI32BindFlags               );
    FlagFormat(TEX_FORMAT_RGBA16_TYPELESS,            true                                      );
    FlagFormat(TEX_FORMAT_RGBA16_FLOAT,               true,         F16BindFlags,           true);
    FlagFormat(TEX_FORMAT_RGBA16_UNORM,               bTexNorm16,   U16BindFlags,           true);
    FlagFormat(TEX_FORMAT_RGBA16_UINT,                true,         UI16BindFlags               );
    FlagFormat(TEX_FORMAT_RGBA16_SNORM,               bTexNorm16,   S16BindFlags,           true);
    FlagFormat(TEX_FORMAT_RGBA16_SINT,                true,         SI16BindFlags               );
    FlagFormat(TEX_FORMAT_RG32_TYPELESS,              true                                      );
    FlagFormat(TEX_FORMAT_RG32_FLOAT,                 true,         F32BindFlags,     bDekstopGL);
    FlagFormat(TEX_FORMAT_RG32_SINT,                  true,         SI32BindFlags               );
    FlagFormat(TEX_FORMAT_RG32_UINT,                  true,         UI32BindFlags               );
    FlagFormat(TEX_FORMAT_R32G8X24_TYPELESS,          true                                      );
    FlagFormat(TEX_FORMAT_D32_FLOAT_S8X24_UINT,       true,         BIND_DEPTH_STENCIL          );
    FlagFormat(TEX_FORMAT_R32_FLOAT_X8X24_TYPELESS,   true,         TexBindFlags,     bDekstopGL);
    FlagFormat(TEX_FORMAT_X32_TYPELESS_G8X24_UINT,    false                                     );
    FlagFormat(TEX_FORMAT_RGB10A2_TYPELESS,           true                                      );
    FlagFormat(TEX_FORMAT_RGB10A2_UNORM,              true,         BindSrvRtvUav,          true);
    FlagFormat(TEX_FORMAT_RGB10A2_UINT,               true,         BindSrvRtvUav               );
    FlagFormat(TEX_FORMAT_R11G11B10_FLOAT,            true,         R11G11B10FBindFlags,    true);
    FlagFormat(TEX_FORMAT_RGBA8_TYPELESS,             true                                      );
    FlagFormat(TEX_FORMAT_RGBA8_UNORM,                true,         U8BindFlags,            true);
    FlagFormat(TEX_FORMAT_RGBA8_UNORM_SRGB,           true,         SRGBA8BindFlags,        true);
    FlagFormat(TEX_FORMAT_RGBA8_UINT,                 true,         UI8BindFlags                );
    FlagFormat(TEX_FORMAT_RGBA8_SNORM,                true,         S8BindFlags,            true);
    FlagFormat(TEX_FORMAT_RGBA8_SINT,                 true,         SI8BindFlags                );
    FlagFormat(TEX_FORMAT_RG16_TYPELESS,              true                                      );
    FlagFormat(TEX_FORMAT_RG16_FLOAT,                 true,         F16BindFlags,           true);
    FlagFormat(TEX_FORMAT_RG16_UNORM,                 bTexNorm16,   U16BindFlags,           true);
    FlagFormat(TEX_FORMAT_RG16_UINT,                  true,         UI16BindFlags               );
    FlagFormat(TEX_FORMAT_RG16_SNORM,                 bTexNorm16,   S16BindFlags,           true);
    FlagFormat(TEX_FORMAT_RG16_SINT,                  true,         SI16BindFlags               );
    FlagFormat(TEX_FORMAT_R32_TYPELESS,               true                                      );
    FlagFormat(TEX_FORMAT_D32_FLOAT,                  true,         BIND_DEPTH_STENCIL          );
    FlagFormat(TEX_FORMAT_R32_FLOAT,                  true,         F32BindFlags,     bDekstopGL);
    FlagFormat(TEX_FORMAT_R32_UINT,                   true,         UI32BindFlags               );
    FlagFormat(TEX_FORMAT_R32_SINT,                   true,         SI32BindFlags               );
    FlagFormat(TEX_FORMAT_R24G8_TYPELESS,             true                                      );
    FlagFormat(TEX_FORMAT_D24_UNORM_S8_UINT,          true,         BIND_DEPTH_STENCIL          );
    FlagFormat(TEX_FORMAT_R24_UNORM_X8_TYPELESS,      true,         TexBindFlags,           true);
    FlagFormat(TEX_FORMAT_X24_TYPELESS_G8_UINT,       false                                     );
    FlagFormat(TEX_FORMAT_RG8_TYPELESS,               true                                      );
    FlagFormat(TEX_FORMAT_RG8_UNORM,                  true,         U8BindFlags,            true);
    FlagFormat(TEX_FORMAT_RG8_UINT,                   true,         UI8BindFlags                );
    FlagFormat(TEX_FORMAT_RG8_SNORM,                  true,         S8BindFlags,            true);
    FlagFormat(TEX_FORMAT_RG8_SINT,                   true,         SI8BindFlags                );
    FlagFormat(TEX_FORMAT_R16_TYPELESS,               true                                      );
    FlagFormat(TEX_FORMAT_R16_FLOAT,                  true,         F16BindFlags,           true);
    FlagFormat(TEX_FORMAT_D16_UNORM,                  true,         BIND_DEPTH_STENCIL          );
    FlagFormat(TEX_FORMAT_R16_UNORM,                  bTexNorm16,   U16BindFlags,           true);
    FlagFormat(TEX_FORMAT_R16_UINT,                   true,         UI16BindFlags               );
    FlagFormat(TEX_FORMAT_R16_SNORM,                  bTexNorm16,   S16BindFlags,           true);
    FlagFormat(TEX_FORMAT_R16_SINT,                   true,         SI16BindFlags               );
    FlagFormat(TEX_FORMAT_R8_TYPELESS,                true                                      );
    FlagFormat(TEX_FORMAT_R8_UNORM,                   true,         U8BindFlags,            true);
    FlagFormat(TEX_FORMAT_R8_UINT,                    true,         UI8BindFlags                );
    FlagFormat(TEX_FORMAT_R8_SNORM,                   true,         S8BindFlags,            true);
    FlagFormat(TEX_FORMAT_R8_SINT,                    true,         SI8BindFlags                );
    FlagFormat(TEX_FORMAT_A8_UNORM,                   bTexSwizzle,  U8BindFlags,            true);
    FlagFormat(TEX_FORMAT_R1_UNORM,                   false                                     ); // Not supported in OpenGL
    FlagFormat(TEX_FORMAT_RGB9E5_SHAREDEXP,           true,         BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_RG8_B8G8_UNORM,             false                                     ); // Not supported in OpenGL
    FlagFormat(TEX_FORMAT_G8R8_G8B8_UNORM,            false                                     ); // Not supported in OpenGL

    FlagFormat(TEX_FORMAT_BC1_TYPELESS,               bS3TC                                     );
    FlagFormat(TEX_FORMAT_BC1_UNORM,                  bS3TC,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_BC1_UNORM_SRGB,             bS3TC,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_BC2_TYPELESS,               bS3TC                                     );
    FlagFormat(TEX_FORMAT_BC2_UNORM,                  bS3TC,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_BC2_UNORM_SRGB,             bS3TC,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_BC3_TYPELESS,               bS3TC                                     );
    FlagFormat(TEX_FORMAT_BC3_UNORM,                  bS3TC,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_BC3_UNORM_SRGB,             bS3TC,        BIND_SHADER_RESOURCE,   true);

    FlagFormat(TEX_FORMAT_BC4_TYPELESS,               bRGTC                                     );
    FlagFormat(TEX_FORMAT_BC4_UNORM,                  bRGTC,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_BC4_SNORM,                  bRGTC,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_BC5_TYPELESS,               bRGTC                                     );
    FlagFormat(TEX_FORMAT_BC5_UNORM,                  bRGTC,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_BC5_SNORM,                  bRGTC,        BIND_SHADER_RESOURCE,   true);

    FlagFormat(TEX_FORMAT_B5G6R5_UNORM,               false                                     ); // Not supported in OpenGL
    FlagFormat(TEX_FORMAT_B5G5R5A1_UNORM,             false                                     ); // Not supported in OpenGL
    FlagFormat(TEX_FORMAT_BGRA8_UNORM,                bTexSwizzle,  BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_BGRX8_UNORM,                false                                     ); // Not supported in OpenGL
    FlagFormat(TEX_FORMAT_R10G10B10_XR_BIAS_A2_UNORM, false                                     ); // Not supported in OpenGL
    FlagFormat(TEX_FORMAT_BGRA8_TYPELESS,             false                                     ); // Not supported in OpenGL
    FlagFormat(TEX_FORMAT_BGRA8_UNORM_SRGB,           false                                     ); // Not supported in OpenGL
    FlagFormat(TEX_FORMAT_BGRX8_TYPELESS,             false                                     ); // Not supported in OpenGL
    FlagFormat(TEX_FORMAT_BGRX8_UNORM_SRGB,           false                                     ); // Not supported in OpenGL

    FlagFormat(TEX_FORMAT_BC6H_TYPELESS,              bBPTC);
    FlagFormat(TEX_FORMAT_BC6H_UF16,                  bBPTC,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_BC6H_SF16,                  bBPTC,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_BC7_TYPELESS,               bBPTC);
    FlagFormat(TEX_FORMAT_BC7_UNORM,                  bBPTC,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_BC7_UNORM_SRGB,             bBPTC,        BIND_SHADER_RESOURCE,   true);

    FlagFormat(TEX_FORMAT_ETC2_RGB8_UNORM,            bETC2,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_ETC2_RGB8_UNORM_SRGB,       bETC2,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_ETC2_RGB8A1_UNORM,          bETC2,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_ETC2_RGB8A1_UNORM_SRGB,     bETC2,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_ETC2_RGBA8_UNORM,           bETC2,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_ETC2_RGBA8_UNORM_SRGB,      bETC2,        BIND_SHADER_RESOURCE,   true);
    // clang-format on

#ifdef DILIGENT_DEVELOPMENT
    const bool bGL43OrAbove = DeviceInfo.Type == RENDER_DEVICE_TYPE_GL && DeviceInfo.APIVersion >= Version{4, 3};

    constexpr int      TestTextureDim = 8;
    constexpr int      MaxTexelSize   = 16;
    std::vector<Uint8> ZeroData(TestTextureDim * TestTextureDim * MaxTexelSize);

    // Go through all formats and try to create small 2D texture to check if the format is supported
    for (auto& FmtInfo : m_TextureFormatsInfo)
    {
        if (FmtInfo.Format == TEX_FORMAT_UNKNOWN)
            continue;

        auto GLFmt = TexFormatToGLInternalTexFormat(FmtInfo.Format);
        if (GLFmt == 0)
        {
            VERIFY(!FmtInfo.Supported, "Format should be marked as unsupported");
            continue;
        }

#    if GL_ARB_internalformat_query2
        // Only works on GL4.3+
        if (bGL43OrAbove)
        {
            GLint params = 0;
            glGetInternalformativ(GL_TEXTURE_2D, GLFmt, GL_INTERNALFORMAT_SUPPORTED, 1, &params);
            CHECK_GL_ERROR("glGetInternalformativ() failed");
            VERIFY(FmtInfo.Supported == (params == GL_TRUE), "This internal format should be supported");
        }
#    else
        (void)bGL43OrAbove; // To suppress warning
#    endif

        // Check that the format is indeed supported
        if (FmtInfo.Supported && !FmtInfo.IsDepthStencil() && !FmtInfo.IsTypeless)
        {
            GLObjectWrappers::GLTextureObj TestGLTex{true};
            // Immediate context has not been created yet, so use raw GL functions
            glBindTexture(GL_TEXTURE_2D, TestGLTex);
            CHECK_GL_ERROR("Failed to bind texture");
            glTexStorage2D(GL_TEXTURE_2D, 1, GLFmt, TestTextureDim, TestTextureDim);
            if (glGetError() == GL_NO_ERROR)
            {
                // It turned out it is not enough to only allocate texture storage
                // For some reason glTexStorage2D() may succeed, but upload operation
                // will later fail. So we need to additionally try to upload some
                // data to the texture
                const auto& TransferAttribs = GetNativePixelTransferAttribs(FmtInfo.Format);
                if (TransferAttribs.IsCompressed)
                {
                    const auto& FmtAttribs = GetTextureFormatAttribs(FmtInfo.Format);
                    static_assert((TestTextureDim & (TestTextureDim - 1)) == 0, "Test texture dim must be power of two!");
                    auto BlockBytesInRow = (TestTextureDim / int{FmtAttribs.BlockWidth}) * int{FmtAttribs.ComponentSize};
                    glCompressedTexSubImage2D(GL_TEXTURE_2D, 0, // mip level
                                              0, 0, TestTextureDim, TestTextureDim,
                                              GLFmt,
                                              (TestTextureDim / int{FmtAttribs.BlockHeight}) * BlockBytesInRow,
                                              ZeroData.data());
                }
                else
                {
                    glTexSubImage2D(GL_TEXTURE_2D, 0, // mip level
                                    0, 0, TestTextureDim, TestTextureDim,
                                    TransferAttribs.PixelFormat, TransferAttribs.DataType,
                                    ZeroData.data());
                }

                if (glGetError() != GL_NO_ERROR)
                {
                    LOG_WARNING_MESSAGE("Failed to upload data to a test ", TestTextureDim, "x", TestTextureDim, " ", FmtInfo.Name,
                                        " texture. This likely indicates that the format is not supported despite being reported so by the device.");
                    FmtInfo.Supported = false;
                }
            }
            else
            {
                LOG_WARNING_MESSAGE("Failed to allocate storage for a test ", TestTextureDim, "x", TestTextureDim, " ", FmtInfo.Name,
                                    " texture. This likely indicates that the format is not supported despite being reported so by the device.");
                FmtInfo.Supported = false;
            }
            glBindTexture(GL_TEXTURE_2D, 0);
        }
    }
#endif
}